

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_compositions.cpp
# Opt level: O3

void __thiscall
icu_63::numparse::impl::ArraySeriesMatcher::ArraySeriesMatcher
          (ArraySeriesMatcher *this,MatcherArray *matchers,int32_t matchersLen)

{
  NumberParseMatcher **__src;
  int iVar1;
  NumberParseMatcher **ppNVar2;
  
  (this->super_SeriesMatcher).super_CompositionMatcher.super_NumberParseMatcher.
  _vptr_NumberParseMatcher = (_func_int **)&PTR__ArraySeriesMatcher_0047c008;
  ppNVar2 = matchers->ptr;
  (this->fMatchers).ptr = ppNVar2;
  iVar1 = matchers->capacity;
  (this->fMatchers).capacity = iVar1;
  (this->fMatchers).needToRelease = matchers->needToRelease;
  __src = matchers->stackArray;
  if (ppNVar2 == __src) {
    ppNVar2 = (this->fMatchers).stackArray;
    (this->fMatchers).ptr = ppNVar2;
    memcpy(ppNVar2,__src,(long)iVar1 << 3);
  }
  else {
    matchers->ptr = __src;
    matchers->capacity = 3;
    matchers->needToRelease = '\0';
  }
  this->fMatchersLen = matchersLen;
  return;
}

Assistant:

ArraySeriesMatcher::ArraySeriesMatcher(MatcherArray& matchers, int32_t matchersLen)
        : fMatchers(std::move(matchers)), fMatchersLen(matchersLen) {
}